

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_newproxy(lua_State *L)

{
  StkId pTVar1;
  GCObject *pGVar2;
  global_State *pgVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  StkId o;
  int *piVar8;
  TValue *pTVar9;
  TValue *pTVar10;
  StkId pTVar11;
  GCObject *o_1;
  int nrec;
  ulong uVar12;
  ulong uVar13;
  TValue *o2;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  auVar6 = _DAT_00115030;
  auVar5 = _DAT_00115020;
  auVar4 = _DAT_00115010;
  pTVar11 = L->top;
  pTVar1 = L->base;
  if (pTVar11 < pTVar1 + 1) {
    uVar13 = 0;
    uVar12 = (long)pTVar1 - (long)pTVar11;
    if (pTVar1 < pTVar11) {
      uVar12 = uVar13;
    }
    uVar12 = uVar12 + 0xf;
    auVar16._8_4_ = (int)uVar12;
    auVar16._0_8_ = uVar12;
    auVar16._12_4_ = (int)(uVar12 >> 0x20);
    auVar14._0_8_ = uVar12 >> 4;
    auVar14._8_8_ = auVar16._8_8_ >> 4;
    piVar8 = &pTVar11[3].tt;
    auVar14 = auVar14 ^ _DAT_00115030;
    do {
      auVar15._8_4_ = (int)uVar13;
      auVar15._0_8_ = uVar13;
      auVar15._12_4_ = (int)(uVar13 >> 0x20);
      auVar16 = (auVar15 | auVar5) ^ auVar6;
      iVar7 = auVar14._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar7 && auVar14._0_4_ < auVar16._0_4_ || iVar7 < auVar16._4_4_)
                & 1)) {
        piVar8[-0xc] = 0;
      }
      if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
          auVar16._12_4_ <= auVar14._12_4_) {
        piVar8[-8] = 0;
      }
      auVar16 = (auVar15 | auVar4) ^ auVar6;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar7 && (iVar17 != iVar7 || auVar16._0_4_ <= auVar14._0_4_)) {
        piVar8[-4] = 0;
        *piVar8 = 0;
      }
      uVar13 = uVar13 + 4;
      piVar8 = piVar8 + 0x10;
    } while (((uVar12 >> 4) + 4 & 0xfffffffffffffffc) != uVar13);
  }
  L->top = pTVar1 + 1;
  iVar7 = 0;
  lua_newuserdata(L,0);
  pTVar9 = L->base;
  if (L->top <= pTVar9) {
    pTVar9 = &luaO_nilobject_;
  }
  if (pTVar9->tt == 0) {
    return 1;
  }
  if (pTVar9->tt == 1) {
    if ((pTVar9->value).b == 0) {
      return 1;
    }
    if (pTVar9 != &luaO_nilobject_) {
      lua_createtable(L,0,nrec);
      pTVar11 = L->top;
      pTVar11->value = pTVar11[-1].value;
      pTVar11->tt = pTVar11[-1].tt;
      pTVar11 = L->top;
      L->top = pTVar11 + 1;
      pTVar11[1].value.b = 1;
      pTVar11[1].tt = 1;
      pTVar11 = L->top;
      L->top = pTVar11 + 1;
      pGVar2 = (L->ci->func->value).gc;
      pTVar9 = (TValue *)&(pGVar2->h).lastfree;
      if ((pGVar2->h).lsizenode == '\0') {
        pTVar9 = &luaO_nilobject_;
      }
      pTVar10 = luaH_set(L,&((pTVar9->value).gc)->h,pTVar11 + -1);
      pTVar10->value = pTVar11->value;
      pTVar10->tt = pTVar11->tt;
      pTVar11 = L->top;
      if ((3 < pTVar11[-1].tt) && ((((pTVar11[-1].value.gc)->gch).marked & 3) != 0)) {
        pGVar2 = (pTVar9->value).gc;
        if (((pGVar2->gch).marked & 4) != 0) {
          pgVar3 = L->l_G;
          (pGVar2->gch).marked = (pGVar2->gch).marked & 0xfb;
          (pGVar2->h).gclist = pgVar3->grayagain;
          pgVar3->grayagain = pGVar2;
          pTVar11 = L->top;
        }
      }
      L->top = pTVar11 + -2;
      goto LAB_00109d18;
    }
  }
  iVar7 = lua_getmetatable(L,iVar7);
  if (iVar7 != 0) {
    pTVar11 = L->top;
    pGVar2 = (L->ci->func->value).gc;
    pTVar9 = (TValue *)&(pGVar2->h).lastfree;
    if ((pGVar2->h).lsizenode == '\0') {
      pTVar9 = &luaO_nilobject_;
    }
    pTVar10 = pTVar11 + -1;
    pTVar9 = luaH_get(&((pTVar9->value).gc)->h,pTVar10);
    pTVar11[-1].value = pTVar9->value;
    pTVar11[-1].tt = pTVar9->tt;
    iVar7 = L->top[-1].tt;
    pTVar11 = L->top + -1;
    if (iVar7 == 1) {
      iVar7 = (pTVar11->value).b;
      L->top = pTVar11;
      if (iVar7 == 0) goto LAB_00109d3a;
    }
    else {
      if (iVar7 == 0) {
        L->top = pTVar11;
        goto LAB_00109d3a;
      }
      L->top = pTVar11;
    }
    lua_getmetatable(L,(int)pTVar10);
LAB_00109d18:
    lua_setmetatable(L,2);
    return 1;
  }
LAB_00109d3a:
  luaL_argerror(L,1,"boolean or proxy expected");
}

Assistant:

static int luaB_newproxy(lua_State*L){
lua_settop(L,1);
lua_newuserdata(L,0);
if(lua_toboolean(L,1)==0)
return 1;
else if(lua_isboolean(L,1)){
lua_newtable(L);
lua_pushvalue(L,-1);
lua_pushboolean(L,1);
lua_rawset(L,lua_upvalueindex(1));
}
else{
int validproxy=0;
if(lua_getmetatable(L,1)){
lua_rawget(L,lua_upvalueindex(1));
validproxy=lua_toboolean(L,-1);
lua_pop(L,1);
}
luaL_argcheck(L,validproxy,1,"boolean or proxy expected");
lua_getmetatable(L,1);
}
lua_setmetatable(L,2);
return 1;
}